

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::add_thousands_sep<wchar_t>::operator()
          (add_thousands_sep<wchar_t> *this,wchar_t **buffer)

{
  uint uVar1;
  size_t sVar2;
  wchar_t *__first;
  wchar_t *pwVar3;
  size_t sVar4;
  wchar_t *pwVar5;
  wchar_t **buffer_local;
  add_thousands_sep<wchar_t> *this_local;
  
  uVar1 = this->digit_index_ + 1;
  this->digit_index_ = uVar1;
  if (uVar1 % 3 == 0) {
    sVar2 = basic_string_view<wchar_t>::size(&this->sep_);
    *buffer = *buffer + -sVar2;
    __first = basic_string_view<wchar_t>::data(&this->sep_);
    pwVar3 = basic_string_view<wchar_t>::data(&this->sep_);
    sVar2 = basic_string_view<wchar_t>::size(&this->sep_);
    pwVar5 = *buffer;
    sVar4 = basic_string_view<wchar_t>::size(&this->sep_);
    pwVar5 = make_checked<wchar_t>(pwVar5,sVar4);
    std::uninitialized_copy<wchar_t_const*,wchar_t*>(__first,pwVar3 + sVar2,pwVar5);
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_checked(buffer, sep_.size()));
  }